

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

GLint __thiscall
gl4cts::ShaderSubroutine::Utils::program::getSubroutineUniformLocation
          (program *this,GLchar *uniform_name,GLenum shader_stage)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  TestError *this_02;
  MessageBuilder local_1b0;
  int local_2c;
  long lStack_28;
  GLint location;
  Functions *gl;
  GLchar *pGStack_18;
  GLenum shader_stage_local;
  GLchar *uniform_name_local;
  program *this_local;
  
  gl._4_4_ = shader_stage;
  pGStack_18 = uniform_name;
  uniform_name_local = (GLchar *)this;
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar1);
  local_2c = 0xffffffff;
  local_2c = (**(code **)(lStack_28 + 0xa90))(this->m_program_object_id,gl._4_4_,pGStack_18);
  err = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(err,"GetSubroutineUniformLocation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1d9);
  if (local_2c == -1) {
    this_00 = deqp::Context::getTestContext(this->m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [21])0x2a19a7e);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&stack0xffffffffffffffe8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [18])0x2a18143);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Subroutine uniform is not available",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x1e0);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return local_2c;
}

Assistant:

GLint Utils::program::getSubroutineUniformLocation(const glw::GLchar* uniform_name, glw::GLenum shader_stage) const
{
	const glw::Functions& gl	   = m_context.getRenderContext().getFunctions();
	GLint				  location = -1;

	location = gl.getSubroutineUniformLocation(m_program_object_id, shader_stage, uniform_name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetSubroutineUniformLocation");

	if (-1 == location)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Subroutine uniform: " << uniform_name
											<< " is not available" << tcu::TestLog::EndMessage;

		TCU_FAIL("Subroutine uniform is not available");
	}

	return location;
}